

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerpIntercept.cpp
# Opt level: O2

LLPoint GeoCalcs::PerpIntercept
                  (LLPoint *llPt1,double dCrs13,LLPoint *llPt2,double *dCrsFromPt,
                  double *dDistFromPt,double dTol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  LLPoint LVar7;
  double dist13;
  double distarray [2];
  double errarray [2];
  InverseResult result;
  LLPoint pt1;
  LLPoint pt2;
  double local_118;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  LLPoint local_d8;
  InverseResult local_c8;
  LLPoint local_a8;
  double local_90;
  LLPoint local_88;
  undefined1 local_78 [16];
  double local_60;
  double *local_58;
  double *local_50;
  LLPoint local_48;
  
  local_c8.distance = 0.0;
  local_c8.azimuth = 0.0;
  local_c8.reverseAzimuth = 0.0;
  local_88.latitude = llPt1->latitude;
  local_88.longitude = llPt1->longitude;
  local_48.latitude = llPt2->latitude;
  local_48.longitude = llPt2->longitude;
  local_f8 = dCrs13;
  local_90 = dTol;
  DistVincenty(&local_88,&local_48,&local_c8);
  if (local_c8.distance <= local_90) {
    *dDistFromPt = 0.0;
    *dCrsFromPt = 0.0;
    local_a8.latitude = local_88.latitude;
    local_a8.longitude = local_88.longitude;
  }
  else {
    local_118 = SignAzimuthDifference(local_f8,local_c8.azimuth);
    local_78._8_4_ = extraout_XMM0_Dc;
    local_78._0_8_ = local_118;
    local_78._12_4_ = extraout_XMM0_Dd;
    local_118 = ABS(local_118);
    local_f0 = kSphereRadius;
    local_60 = tan(local_c8.distance / kSphereRadius);
    dVar1 = cos((double)local_78._0_8_);
    local_e8 = atan(ABS(dVar1) * local_60);
    local_e8 = local_e8 * local_f0;
    local_100 = local_e8;
    local_58 = dCrsFromPt;
    local_50 = dDistFromPt;
    if (local_118 <= 1.5707963267948966) {
      uVar5 = SUB84(local_f8,0);
      uVar6 = (undefined4)((ulong)local_f8 >> 0x20);
      if (ABS(local_e8) < 277800.0) {
        LVar7 = DestVincenty(&local_88,local_f8 + 3.141592653589793,277800.0);
        local_d8.latitude = LVar7.latitude;
        local_d8.longitude = LVar7.longitude;
        local_e8 = local_e8 + 277800.0;
        local_100 = local_e8;
        DistVincenty(&local_d8,&local_88,&local_c8);
        uVar5 = SUB84(local_c8.azimuth,0);
        uVar6 = (undefined4)((ulong)local_c8.azimuth >> 0x20);
        local_88.latitude = local_d8.latitude;
        local_88.longitude = local_d8.longitude;
      }
    }
    else {
      LVar7 = DestVincenty(&local_88,local_f8 + 3.141592653589793,local_e8 + 277800.0);
      local_d8.latitude = LVar7.latitude;
      local_d8.longitude = LVar7.longitude;
      local_100 = 277800.0;
      DistVincenty(&local_d8,&local_88,&local_c8);
      uVar5 = SUB84(local_c8.azimuth,0);
      uVar6 = (undefined4)((ulong)local_c8.azimuth >> 0x20);
      local_88.latitude = local_d8.latitude;
      local_88.longitude = local_d8.longitude;
      local_e8 = 277800.0;
    }
    local_f8 = (double)CONCAT44(uVar6,uVar5);
    LVar7 = DestVincenty(&local_88,(double)CONCAT44(uVar6,uVar5),local_e8);
    local_a8.latitude = LVar7.latitude;
    local_a8.longitude = LVar7.longitude;
    DistVincenty(&local_a8,&local_88,&local_c8);
    local_78._0_8_ = local_c8.azimuth;
    DistVincenty(&local_a8,&local_48,&local_c8);
    local_f0 = local_c8.distance;
    dVar1 = SignAzimuthDifference((double)local_78._0_8_,local_c8.azimuth);
    local_d8.latitude = ABS(dVar1) + -1.5707963267948966;
    local_e0 = ABS(local_d8.latitude * local_f0 + local_e8);
    LVar7 = DestVincenty(&local_88,local_f8,local_e0);
    local_a8.latitude = LVar7.latitude;
    local_a8.longitude = LVar7.longitude;
    DistVincenty(&local_a8,&local_88,&local_c8);
    dVar1 = local_c8.azimuth;
    DistVincenty(&local_a8,&local_48,&local_c8);
    local_118 = local_c8.azimuth;
    dVar1 = SignAzimuthDifference(dVar1,local_c8.azimuth);
    uVar4 = 0;
    dVar2 = 0.0;
    while ((dVar3 = local_100, local_d8.longitude = ABS(dVar1) + -1.5707963267948966, uVar4 == 0 ||
           ((uVar4 < 0xf && (local_90 < dVar2))))) {
      FindLinearRoot(&local_e8,&local_d8.latitude,&local_100);
      uVar5 = SUB84(local_100,0);
      uVar6 = (undefined4)((ulong)local_100 >> 0x20);
      if (NAN(local_100)) {
        uVar5 = SUB84(dVar3,0);
        uVar6 = (undefined4)((ulong)dVar3 >> 0x20);
        local_100 = dVar3;
      }
      LVar7 = DestVincenty(&local_88,local_f8,(double)CONCAT44(uVar6,uVar5));
      local_a8.latitude = LVar7.latitude;
      local_a8.longitude = LVar7.longitude;
      DistVincenty(&local_a8,&local_88,&local_c8);
      dVar1 = local_c8.azimuth;
      DistVincenty(&local_a8,&local_48,&local_c8);
      local_f0 = local_c8.distance;
      local_e8 = local_e0;
      local_e0 = local_100;
      local_d8.latitude = local_d8.longitude;
      local_118 = local_c8.azimuth;
      dVar1 = SignAzimuthDifference(dVar1,local_c8.azimuth);
      uVar4 = uVar4 + 1;
      dVar2 = ABS(local_e0 - local_e8);
    }
    *local_58 = local_118;
    *local_50 = local_f0;
  }
  LVar7.longitude = local_a8.longitude;
  LVar7.latitude = local_a8.latitude;
  return LVar7;
}

Assistant:

LLPoint PerpIntercept(const LLPoint &llPt1, double dCrs13, const LLPoint &llPt2,
                          double &dCrsFromPt, double &dDistFromPt, double dTol)
    {
        InverseResult result;
        LLPoint pt1 = llPt1;
        LLPoint pt2 = llPt2;
        DistVincenty(pt1, pt2, result);

        if (result.distance <= dTol)
        {
            // pt1, pt2 and projected pt3 are all the same;
            dCrsFromPt = dDistFromPt = 0.0;
            return pt1;
        }


        const double dAngle = fabs(SignAzimuthDifference(dCrs13, result.azimuth));
        double dist13 = kSphereRadius * atan(tan(result.distance / kSphereRadius) * fabs(cos(dAngle)));

        if (dAngle > M_PI_2)
        {
            LLPoint newPoint;
            newPoint = DestVincenty(pt1, dCrs13 + M_PI, dist13 + NmToMeters(150.0));
            dist13 = NmToMeters(150.0);

            DistVincenty(newPoint, pt1, result);
            dCrs13 = result.azimuth;
            pt1 = newPoint;
        }
        else if (fabs(dist13) < NmToMeters(150.0))
        {
            LLPoint newPoint;
            newPoint = DestVincenty(pt1, dCrs13 + M_PI, NmToMeters(150.0));
            dist13 += NmToMeters(150.0);

            DistVincenty(newPoint, pt1, result);
            dCrs13 = result.azimuth;
            pt1 = newPoint;
        }

        LLPoint pt3 = DestVincenty(pt1, dCrs13, dist13);
        DistVincenty(pt3, pt1, result);
        double crs31 = result.azimuth;

        DistVincenty(pt3, pt2, result);
        double crs32 = result.azimuth;
        double dist23 = result.distance;

        double errarray[2], distarray[2];
        errarray[0] = fabs(SignAzimuthDifference(crs31, crs32)) - M_PI_2;
        distarray[0] = dist13;
        distarray[1] = fabs(distarray[0] + errarray[0] * dist23);

        pt3 = DestVincenty(pt1, dCrs13, distarray[1]);
        DistVincenty(pt3, pt1, result);
        crs31 = result.azimuth;

        DistVincenty(pt3, pt2, result);
        crs32 = result.azimuth;

        errarray[1] = fabs(SignAzimuthDifference(crs31, crs32)) - M_PI_2;

        int k = 0;
        double dError = 0.0;
        while (k == 0 || ((dError > dTol) && (k < 15)))
        {
            double oldDist13 = dist13;
            FindLinearRoot(distarray, errarray, dist13);
            if (std::isnan(dist13))
                dist13 = oldDist13;

            pt3 = DestVincenty(pt1, dCrs13, dist13);
            DistVincenty(pt3, pt1, result);
            crs31 = result.azimuth;

            DistVincenty(pt3, pt2, result);
            dist23 = result.distance;
            crs32 = result.azimuth;

            distarray[0] = distarray[1];
            distarray[1] = dist13;
            errarray[0] = errarray[1];
            errarray[1] = fabs(SignAzimuthDifference(crs31, crs32)) - M_PI_2;
            dError = fabs(distarray[1] - distarray[0]);
            k++;
        }

        dCrsFromPt = crs32;
        dDistFromPt = dist23;
        return pt3;
    }